

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamWriter_p.cpp
# Opt level: O2

bool __thiscall
BamTools::Internal::BamWriterPrivate::SaveAlignment(BamWriterPrivate *this,BamAlignment *al)

{
  if ((al->SupportData).HasCoreOnly == true) {
    WriteCoreAlignment(this,al);
  }
  else {
    WriteAlignment(this,al);
  }
  return true;
}

Assistant:

bool BamWriterPrivate::SaveAlignment(const BamAlignment& al)
{

    try {

        // if BamAlignment contains only the core data and a raw char data buffer
        // (as a result of BamReader::GetNextAlignmentCore())
        if (al.SupportData.HasCoreOnly) {
            WriteCoreAlignment(al);

            // otherwise, BamAlignment should contain character in the standard fields: Name, QueryBases, etc
            // (resulting from BamReader::GetNextAlignment() *OR* being generated directly by client code)
        } else {
            WriteAlignment(al);
        }

        // if we get here, everything OK
        return true;

    } catch (const BamException& e) {
        m_errorString = e.what();
        return false;
    }
}